

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_links.hpp
# Opt level: O0

void __thiscall libtorrent::aux::resolve_links::~resolve_links(resolve_links *this)

{
  resolve_links *this_local;
  
  ::std::
  unordered_multimap<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::hash<libtorrent::digest32<256L>_>,_std::equal_to<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>_>
  ::~unordered_multimap(&this->m_file_roots);
  ::std::
  unordered_multimap<long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>_>
  ::~unordered_multimap(&this->m_file_sizes);
  container_wrapper<libtorrent::aux::resolve_links::link_t,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>_>
  ::~container_wrapper(&this->m_links);
  ::std::shared_ptr<const_libtorrent::torrent_info>::~shared_ptr(&this->m_torrent_file);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT resolve_links
	{
		struct TORRENT_EXTRA_EXPORT link_t
		{
			std::shared_ptr<torrent_info const> ti;
			std::string save_path;
			file_index_t file_idx;
		};

		explicit resolve_links(std::shared_ptr<torrent_info const> ti);

		// check to see if any files are shared with this torrent
		void match(std::shared_ptr<torrent_info const> const& ti
			, std::string const& save_path);

		aux::vector<link_t, file_index_t> const& get_links() const
		{ return m_links; }

	private:

		void match_v1(std::shared_ptr<torrent_info const> const& ti
			, std::string const& save_path);
		void match_v2(std::shared_ptr<torrent_info const> const& ti
			, std::string const& save_path);

		// this is the torrent we're trying to find files for.
		std::shared_ptr<torrent_info const> m_torrent_file;

		// each file in m_torrent_file has an entry in this vector. Any file
		// that also exists somewhere else, is filled in with the corresponding
		// torrent_info object and file index
		aux::vector<link_t, file_index_t> m_links;

		// maps file size to file index, in m_torrent_file
		std::unordered_multimap<std::int64_t, file_index_t> m_file_sizes;

		// maps file root hash to file index, in m_torrent_file
		std::unordered_multimap<sha256_hash, file_index_t> m_file_roots;
	}